

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_21a7::DataTransform<short,_int>::Run
          (DataTransform<short,_int> *this,istream *input_stream)

{
  uint uVar1;
  NumericType NVar2;
  WarningType WVar3;
  char *__nptr;
  bool bVar4;
  uint uVar5;
  int *piVar6;
  undefined8 uVar7;
  ostream *poVar8;
  size_t sVar9;
  int iVar10;
  uint data_to_write;
  int iVar11;
  ushort in_FPUControlWord;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  double dVar12;
  short input_data;
  string word;
  char buffer [128];
  short local_25e;
  ushort local_25c;
  short local_25a;
  string local_258;
  string *local_238;
  char *local_230;
  long local_228;
  char local_220 [96];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_238 = &this->print_format_;
  iVar11 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      local_230 = local_220;
      local_228 = 0;
      local_220[0] = '\0';
      std::operator>>(input_stream,(string *)&local_230);
      __nptr = local_230;
      if (local_228 == 0) {
        iVar10 = 2;
        bVar4 = false;
      }
      else {
        piVar6 = __errno_location();
        iVar10 = *piVar6;
        *piVar6 = 0;
        strtold(__nptr,(char **)&local_258);
        if (local_258._M_dataplus._M_p == __nptr) {
          uVar7 = std::__throw_invalid_argument("stold");
LAB_00118a39:
          if (local_230 != local_220) {
            operator_delete(local_230);
          }
          _Unwind_Resume(uVar7);
        }
        if (*piVar6 == 0) {
          *piVar6 = iVar10;
        }
        else if (*piVar6 == 0x22) {
          uVar7 = std::__throw_out_of_range("stold");
          goto LAB_00118a39;
        }
        local_25c = in_FPUControlWord | 0xc00;
        local_25e = (short)ROUND(in_ST0);
        iVar10 = 0;
        bVar4 = true;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
        local_25a = local_25e;
      }
      if (local_230 != local_220) {
        operator_delete(local_230);
      }
      if (bVar4) {
LAB_001187a6:
        uVar5 = (uint)local_25e;
        data_to_write = this->minimum_value_;
        uVar1 = this->maximum_value_;
        if ((int)data_to_write < (int)uVar1) {
          NVar2 = this->input_numeric_type_;
          if (NVar2 != kFloatingPoint) {
            if (NVar2 == kUnsignedInteger) {
              bVar4 = true;
              if ((data_to_write <= uVar5) && (bVar4 = uVar1 < uVar5, data_to_write = uVar1, !bVar4)
                 ) {
                data_to_write = uVar5;
              }
              goto LAB_001187f3;
            }
            if (NVar2 != kSignedInteger) goto LAB_001187da;
          }
          bVar4 = true;
          if (((int)data_to_write <= (int)uVar5) &&
             (bVar4 = (int)uVar1 < (int)uVar5, data_to_write = uVar1, (int)uVar5 <= (int)uVar1)) {
            data_to_write = uVar5;
          }
        }
        else {
LAB_001187da:
          bVar4 = false;
          data_to_write = uVar5;
        }
LAB_001187f3:
        if ((!bVar4) && (this->rounding_ != false)) {
          if (local_25e < 1) {
            dVar12 = (double)(int)uVar5 + -0.5;
          }
          else {
            dVar12 = (double)(int)uVar5 + 0.5;
          }
          data_to_write = (uint)dVar12;
        }
        if ((bool)(bVar4 & this->warning_type_ != kIgnore)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar11);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"th data is over the range of output type",0x28);
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"x2x","");
          sptk::PrintErrorMessage(&local_258,(ostringstream *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p);
          }
          WVar3 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
          std::ios_base::~ios_base(local_1c0);
          iVar10 = 1;
          if (WVar3 == kExit) goto LAB_0011898c;
        }
        if (this->is_ascii_output_ == true) {
          bVar4 = sptk::SnPrintf<int>(data_to_write,local_238,0x80,local_b8);
          iVar10 = 1;
          if (bVar4) {
            sVar9 = strlen(local_b8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b8,sVar9)
            ;
            if ((iVar11 + 1) % this->num_column_ == 0) {
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
              std::ostream::put(-0x78);
              std::ostream::flush();
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
            }
LAB_0011898a:
            iVar10 = 0;
          }
        }
        else {
          bVar4 = sptk::WriteStream<int>(data_to_write,(ostream *)&std::cout);
          iVar10 = 1;
          if (bVar4) goto LAB_0011898a;
        }
      }
    }
    else {
      bVar4 = sptk::ReadStream<short>(&local_25e,input_stream);
      iVar10 = 2;
      if (bVar4) goto LAB_001187a6;
    }
LAB_0011898c:
    if (iVar10 != 0) {
      if (iVar10 == 2) {
        bVar4 = true;
        if ((this->is_ascii_output_ == true) && (iVar11 % this->num_column_ != 0)) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
        }
      }
      else {
        bVar4 = false;
      }
      return bVar4;
    }
    iVar11 = iVar11 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }